

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

size_t Catch::listTests(Config *config)

{
  SpecialProperties SVar1;
  pointer pbVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestSpecParser *this;
  IRegistryHub *pIVar4;
  undefined4 extraout_var_01;
  IColourImpl *pIVar5;
  undefined4 extraout_var_02;
  pointer pcVar6;
  pointer pbVar7;
  pointer _str;
  Colour colourGuard;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  undefined1 local_158 [32];
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> local_138;
  undefined1 local_118 [32];
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> local_f8;
  undefined1 local_d8 [8];
  _Alloc_hider local_d0;
  char local_c8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  undefined1 local_a0 [16];
  pointer local_90;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> vStack_88;
  TagAliasRegistry *local_70;
  Config *local_68;
  pointer local_60;
  TextAttributes local_58;
  
  iVar3 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])();
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
            (&local_138,
             (vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
             CONCAT44(extraout_var,iVar3));
  iVar3 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])(config);
  if (*(long *)CONCAT44(extraout_var_00,iVar3) == ((long *)CONCAT44(extraout_var_00,iVar3))[1]) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"All available test cases:\n",0x1a);
    TagAliasRegistry::get();
    local_c0._8_8_ = 0;
    local_b0._M_local_buf[0] = '\0';
    local_a0._0_8_ = (pointer)0x0;
    local_a0._8_8_ = (pointer)0x0;
    local_90 = (pointer)0x0;
    vStack_88.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_88.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_88.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_70 = &TagAliasRegistry::get::instance;
    local_118._0_8_ = local_118 + 0x10;
    local_c0._M_allocated_capacity = (size_type)&local_b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"*","");
    this = TestSpecParser::parse((TestSpecParser *)local_d8,(string *)local_118);
    TestSpecParser::addFilter(this);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               local_158,&(this->m_testSpec).m_filters);
    local_58.width =
         (size_t)local_138.
                 super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_58.indent =
         (size_t)local_138.
                 super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    local_58.initialIndent =
         (size_t)local_138.
                 super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    local_138.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_158._16_8_;
    local_138.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_158._0_8_;
    local_138.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_158._8_8_;
    local_158._0_8_ = (pointer)0x0;
    local_158._8_8_ = (pointer)0x0;
    local_158._16_8_ = (pointer)0x0;
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               &local_58);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               local_158);
    if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
      operator_delete((void *)local_118._0_8_);
    }
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              (&vStack_88);
    std::
    vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ::~vector((vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
               *)local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_allocated_capacity != &local_b0) {
      operator_delete((void *)local_c0._M_allocated_capacity);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Matching test cases:\n",0x15);
  }
  local_118._16_8_ = 0x4f;
  local_118[0x18] = '\t';
  local_58.initialIndent = 0xffffffffffffffff;
  local_58.width = 0x4f;
  local_58.tabChar = '\t';
  local_118._0_8_ = (pointer)0x2;
  local_118._8_8_ = 4;
  local_58.indent = 6;
  local_f8.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar4 = getRegistryHub();
  iVar3 = (*pIVar4->_vptr_IRegistryHub[3])(pIVar4);
  (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x18))
            ((long *)CONCAT44(extraout_var_01,iVar3),&local_138,config,&local_f8);
  local_60 = local_f8.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
             super__Vector_impl_data._M_finish;
  pcVar6 = (pointer)0x0;
  _str = local_f8.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
         super__Vector_impl_data._M_start;
  local_68 = config;
  if (local_f8.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_f8.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      SVar1 = (_str->super_TestCaseInfo).properties;
      local_158._0_8_ = local_158._0_8_ & 0xffffffffffffff00;
      pIVar5 = Colour::impl();
      (**(code **)(*(long *)pIVar5 + 0x10))(pIVar5,(int)(SVar1 << 0x1e) >> 0x1f & 0x17);
      Tbc::Text::Text((Text *)local_d8,(string *)_str,(TextAttributes *)local_118);
      pbVar2 = local_90;
      for (pbVar7 = (pointer)local_a0._8_8_; pbVar7 != pbVar2; pbVar7 = pbVar7 + 1) {
        if (pbVar7 != (pointer)local_a0._8_8_) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)(pbVar7->_M_dataplus)._M_p,pbVar7->_M_string_length
                  );
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
      std::ostream::put('H');
      std::ostream::flush();
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_a0 + 8));
      if (local_d8 != (undefined1  [8])local_c8) {
        operator_delete((void *)local_d8);
      }
      if ((_str->super_TestCaseInfo).tags._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        Tbc::Text::Text((Text *)local_d8,&(_str->super_TestCaseInfo).tagsAsString,&local_58);
        pbVar2 = local_90;
        for (pbVar7 = (pointer)local_a0._8_8_; pbVar7 != pbVar2; pbVar7 = pbVar7 + 1) {
          if (pbVar7 != (pointer)local_a0._8_8_) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)(pbVar7->_M_dataplus)._M_p,
                     pbVar7->_M_string_length);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
        std::ostream::put('H');
        std::ostream::flush();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_a0 + 8));
        if (local_d8 != (undefined1  [8])local_c8) {
          operator_delete((void *)local_d8);
        }
      }
      pcVar6 = pcVar6 + 1;
      Colour::~Colour((Colour *)local_158);
      _str = _str + 1;
    } while (_str != local_60);
  }
  iVar3 = (*(local_68->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.
            super_NonCopyable._vptr_NonCopyable[0xd])();
  local_d8 = (undefined1  [8])pcVar6;
  if (*(long *)CONCAT44(extraout_var_02,iVar3) == ((long *)CONCAT44(extraout_var_02,iVar3))[1]) {
    local_158._0_8_ = local_158 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"test case","");
    local_d0._M_p = (pointer)&local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,local_158._0_8_,
               (undefined1 *)
               ((long)&(((vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                          *)local_158._8_8_)->
                       super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + local_158._0_8_));
    operator<<((ostream *)&std::cout,(pluralise *)local_d8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
  }
  else {
    local_158._0_8_ = local_158 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"matching test case","");
    local_d0._M_p = (pointer)&local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,local_158._0_8_,
               (undefined1 *)
               ((long)&(((vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                          *)local_158._8_8_)->
                       super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + local_158._0_8_));
    operator<<((ostream *)&std::cout,(pluralise *)local_d8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_p != &local_c0) {
    operator_delete(local_d0._M_p);
  }
  if ((pointer)local_158._0_8_ != (pointer)(local_158 + 0x10)) {
    operator_delete((void *)local_158._0_8_);
  }
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector(&local_f8);
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            (&local_138);
  return (size_t)pcVar6;
}

Assistant:

inline std::size_t listTests( Config const& config ) {

        TestSpec testSpec = config.testSpec();
        if( config.testSpec().hasFilters() )
            std::cout << "Matching test cases:\n";
        else {
            std::cout << "All available test cases:\n";
            testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "*" ).testSpec();
        }

        std::size_t matchedTests = 0;
        TextAttributes nameAttr, tagsAttr;
        nameAttr.setInitialIndent( 2 ).setIndent( 4 );
        tagsAttr.setIndent( 6 );

        std::vector<TestCase> matchedTestCases;
        getRegistryHub().getTestCaseRegistry().getFilteredTests( testSpec, config, matchedTestCases );
        for( std::vector<TestCase>::const_iterator it = matchedTestCases.begin(), itEnd = matchedTestCases.end();
                it != itEnd;
                ++it ) {
            matchedTests++;
            TestCaseInfo const& testCaseInfo = it->getTestCaseInfo();
            Colour::Code colour = testCaseInfo.isHidden()
                ? Colour::SecondaryText
                : Colour::None;
            Colour colourGuard( colour );

            std::cout << Text( testCaseInfo.name, nameAttr ) << std::endl;
            if( !testCaseInfo.tags.empty() )
                std::cout << Text( testCaseInfo.tagsAsString, tagsAttr ) << std::endl;
        }

        if( !config.testSpec().hasFilters() )
            std::cout << pluralise( matchedTests, "test case" ) << "\n" << std::endl;
        else
            std::cout << pluralise( matchedTests, "matching test case" ) << "\n" << std::endl;
        return matchedTests;
    }